

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_python.cpp
# Opt level: O1

void __thiscall
flatbuffers::python::anon_unknown_0::PythonStubGenerator::StructBuilderArgs
          (PythonStubGenerator *this,StructDef *struct_def,string *prefix,Imports *imports,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args)

{
  FieldDef *pFVar1;
  StructDef *struct_def_00;
  undefined8 *puVar2;
  long *plVar3;
  size_type *psVar4;
  long *plVar5;
  undefined8 uVar6;
  ulong uVar7;
  ulong *puVar8;
  pointer ppFVar9;
  Type type;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_140;
  ulong *local_120;
  long local_118;
  ulong local_110;
  long lStack_108;
  PythonStubGenerator *local_100;
  string local_f8;
  IdlNamer *local_d8;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *local_d0;
  Imports *local_c8;
  string *local_c0;
  long *local_b8;
  long local_b0;
  long local_a8;
  long lStack_a0;
  string local_98;
  Type local_78;
  pointer local_58;
  ulong *local_50 [2];
  ulong local_40 [2];
  
  ppFVar9 = (struct_def->fields).vec.
            super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  local_58 = (struct_def->fields).vec.
             super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>.
             _M_impl.super__Vector_impl_data._M_finish;
  if (ppFVar9 != local_58) {
    local_d8 = &this->namer_;
    local_100 = this;
    local_d0 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)args;
    local_c8 = imports;
    local_c0 = prefix;
    do {
      pFVar1 = *ppFVar9;
      if ((pFVar1->value).type.base_type == BASE_TYPE_ARRAY) {
        local_78.base_type = (pFVar1->value).type.element;
        local_78.struct_def._0_4_ = *(undefined4 *)&(pFVar1->value).type.struct_def;
        local_78.struct_def._4_4_ = *(undefined4 *)((long)&(pFVar1->value).type.struct_def + 4);
        local_78.enum_def = (pFVar1->value).type.enum_def;
        local_78.element = BASE_TYPE_NONE;
        local_78.fixed_length = (pFVar1->value).type.fixed_length;
      }
      else {
        local_78.base_type = (pFVar1->value).type.base_type;
        local_78.element = (pFVar1->value).type.element;
        local_78.struct_def._0_4_ = *(undefined4 *)&(pFVar1->value).type.struct_def;
        local_78.struct_def._4_4_ = *(undefined4 *)((long)&(pFVar1->value).type.struct_def + 4);
        local_78.enum_def = (pFVar1->value).type.enum_def;
        local_78.fixed_length = (pFVar1->value).type.fixed_length;
        local_78._26_6_ = *(undefined6 *)&(pFVar1->value).type.field_0x1a;
      }
      if (local_78.base_type == BASE_TYPE_STRUCT) {
        struct_def_00 = (pFVar1->value).type.struct_def;
        (*(local_d8->super_Namer)._vptr_Namer[0x12])(&local_120);
        puVar2 = (undefined8 *)
                 std::__cxx11::string::replace
                           ((ulong)&local_120,0,(char *)0x0,(ulong)(local_c0->_M_dataplus)._M_p);
        local_140._M_dataplus._M_p = (pointer)&local_140.field_2;
        psVar4 = puVar2 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar2 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar4) {
          local_140.field_2._M_allocated_capacity = *psVar4;
          local_140.field_2._8_8_ = puVar2[3];
        }
        else {
          local_140.field_2._M_allocated_capacity = *psVar4;
          local_140._M_dataplus._M_p = (pointer)*puVar2;
        }
        local_140._M_string_length = puVar2[1];
        *puVar2 = psVar4;
        puVar2[1] = 0;
        *(undefined1 *)(puVar2 + 2) = 0;
        plVar3 = (long *)std::__cxx11::string::append((char *)&local_140);
        psVar4 = (size_type *)(plVar3 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar3 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar4) {
          local_98.field_2._M_allocated_capacity = *psVar4;
          local_98.field_2._8_8_ = plVar3[3];
          local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
        }
        else {
          local_98.field_2._M_allocated_capacity = *psVar4;
          local_98._M_dataplus._M_p = (pointer)*plVar3;
        }
        local_98._M_string_length = plVar3[1];
        *plVar3 = (long)psVar4;
        plVar3[1] = 0;
        *(undefined1 *)(plVar3 + 2) = 0;
        StructBuilderArgs(local_100,struct_def_00,&local_98,local_c8,
                          (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)local_d0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_98._M_dataplus._M_p != &local_98.field_2) {
          operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_140._M_dataplus._M_p != &local_140.field_2) {
          operator_delete(local_140._M_dataplus._M_p,local_140.field_2._M_allocated_capacity + 1);
        }
        uVar7 = local_110;
        puVar8 = local_120;
        if (local_120 != &local_110) {
LAB_0027a404:
          operator_delete(puVar8,uVar7 + 1);
        }
      }
      else {
        (*(local_d8->super_Namer)._vptr_Namer[0x12])(local_50);
        plVar3 = (long *)std::__cxx11::string::replace
                                   ((ulong)local_50,0,(char *)0x0,
                                    (ulong)(local_c0->_M_dataplus)._M_p);
        plVar5 = plVar3 + 2;
        if ((long *)*plVar3 == plVar5) {
          local_a8 = *plVar5;
          lStack_a0 = plVar3[3];
          local_b8 = &local_a8;
        }
        else {
          local_a8 = *plVar5;
          local_b8 = (long *)*plVar3;
        }
        local_b0 = plVar3[1];
        *plVar3 = (long)plVar5;
        plVar3[1] = 0;
        *(undefined1 *)(plVar3 + 2) = 0;
        plVar3 = (long *)std::__cxx11::string::append((char *)&local_b8);
        puVar8 = (ulong *)(plVar3 + 2);
        if ((ulong *)*plVar3 == puVar8) {
          local_110 = *puVar8;
          lStack_108 = plVar3[3];
          local_120 = &local_110;
        }
        else {
          local_110 = *puVar8;
          local_120 = (ulong *)*plVar3;
        }
        local_118 = plVar3[1];
        *plVar3 = (long)puVar8;
        plVar3[1] = 0;
        *(undefined1 *)(plVar3 + 2) = 0;
        (anonymous_namespace)::PythonStubGenerator::TypeOf_abi_cxx11_
                  (&local_f8,(PythonStubGenerator *)local_100,&local_78,local_c8);
        uVar7 = 0xf;
        if (local_120 != &local_110) {
          uVar7 = local_110;
        }
        if (uVar7 < local_f8._M_string_length + local_118) {
          uVar6 = 0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
            uVar6 = local_f8.field_2._M_allocated_capacity;
          }
          if ((ulong)uVar6 < local_f8._M_string_length + local_118) goto LAB_0027a307;
          puVar2 = (undefined8 *)
                   std::__cxx11::string::replace((ulong)&local_f8,0,(char *)0x0,(ulong)local_120);
        }
        else {
LAB_0027a307:
          puVar2 = (undefined8 *)
                   std::__cxx11::string::_M_append
                             ((char *)&local_120,(ulong)local_f8._M_dataplus._M_p);
        }
        local_140._M_dataplus._M_p = (pointer)&local_140.field_2;
        psVar4 = puVar2 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar2 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar4) {
          local_140.field_2._M_allocated_capacity = *psVar4;
          local_140.field_2._8_8_ = puVar2[3];
        }
        else {
          local_140.field_2._M_allocated_capacity = *psVar4;
          local_140._M_dataplus._M_p = (pointer)*puVar2;
        }
        local_140._M_string_length = puVar2[1];
        *puVar2 = psVar4;
        puVar2[1] = 0;
        *(undefined1 *)psVar4 = 0;
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>(local_d0,&local_140);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_140._M_dataplus._M_p != &local_140.field_2) {
          operator_delete(local_140._M_dataplus._M_p,local_140.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
          operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
        }
        if (local_120 != &local_110) {
          operator_delete(local_120,local_110 + 1);
        }
        if (local_b8 != &local_a8) {
          operator_delete(local_b8,local_a8 + 1);
        }
        uVar7 = local_40[0];
        puVar8 = local_50[0];
        if (local_50[0] != local_40) goto LAB_0027a404;
      }
      ppFVar9 = ppFVar9 + 1;
    } while (ppFVar9 != local_58);
  }
  return;
}

Assistant:

void StructBuilderArgs(const StructDef &struct_def, const std::string prefix,
                         Imports *imports,
                         std::vector<std::string> *args) const {
    for (const FieldDef *field : struct_def.fields.vec) {
      const Type type = IsArray(field->value.type)
                            ? field->value.type.VectorType()
                            : field->value.type;
      if (type.base_type == BASE_TYPE_STRUCT) {
        StructBuilderArgs(*field->value.type.struct_def,
                          prefix + namer_.Field(*field) + "_", imports, args);
      } else {
        args->push_back(prefix + namer_.Field(*field) + ": " +
                        TypeOf(type, imports));
      }
    }
  }